

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O2

void duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  idx_t count;
  unsigned_long *puVar3;
  float *pfVar4;
  data_ptr_t pdVar5;
  list_entry_t *plVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  bool bVar9;
  BoundFunctionExpression *pBVar10;
  string *psVar11;
  reference vec;
  reference vec_00;
  idx_t iVar12;
  idx_t iVar13;
  Vector *this;
  Vector *this_00;
  InvalidInputException *pIVar14;
  idx_t iVar15;
  idx_t i_2;
  ulong uVar16;
  ulong uVar17;
  uint64_t *puVar18;
  ulong uVar19;
  ulong uVar20;
  ValidityMask *pVVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  idx_t i;
  ulong uVar25;
  float fVar26;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t right_06;
  uint64_t *local_168;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat local_c8;
  float *rhs_data;
  float *lhs_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar10 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  psVar11 = &(pBVar10->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  count = args->count;
  vec = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vec_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  iVar12 = ListVector::GetListSize(vec);
  iVar13 = ListVector::GetListSize(vec_00);
  this = ListVector::GetEntry(vec);
  this_00 = ListVector::GetEntry(vec_00);
  Vector::Flatten(this,iVar12);
  Vector::Flatten(this_00,iVar13);
  FlatVector::VerifyFlatVector(this);
  bVar9 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                    (&(this->validity).super_TemplatedValidityMask<unsigned_long>,iVar12);
  if (!bVar9) {
    pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&ldata,"%s: left argument can not contain NULL values",
               (allocator *)&local_c8);
    ::std::__cxx11::string::string((string *)&local_50,(string *)psVar11);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar14,(string *)&ldata,&local_50);
    __cxa_throw(pIVar14,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(this_00);
  bVar9 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                    (&(this_00->validity).super_TemplatedValidityMask<unsigned_long>,iVar13);
  if (!bVar9) {
    pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&ldata,"%s: right argument can not contain NULL values",
               (allocator *)&local_c8);
    ::std::__cxx11::string::string((string *)&local_70,(string *)psVar11);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar14,(string *)&ldata,&local_70);
    __cxa_throw(pIVar14,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lhs_data = (float *)this->data;
  rhs_data = (float *)this_00->data;
  VVar1 = vec->vector_type;
  VVar2 = vec_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pfVar4 = (float *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      fun.lhs_data = &lhs_data;
      fun.func_name = psVar11;
      fun.rhs_data = &rhs_data;
      fVar26 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                         (fun,*(list_entry_t *)vec->data,*(list_entry_t *)vec_00->data,
                          &result->validity,0);
      *pfVar4 = fVar26;
      goto LAB_00cf11e4;
    }
  }
  else if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
    pdVar5 = vec->data;
    plVar6 = (list_entry_t *)vec_00->data;
    puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar7 = result->data;
      FlatVector::VerifyFlatVector(result);
      pVVar21 = &result->validity;
      FlatVector::VerifyFlatVector(vec);
      TemplatedValidityMask<unsigned_long>::Copy
                (&pVVar21->super_TemplatedValidityMask<unsigned_long>,
                 &(vec->validity).super_TemplatedValidityMask<unsigned_long>,count);
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        local_168 = (uint64_t *)(pdVar5 + 8);
        for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
          fun_05.lhs_data = &lhs_data;
          fun_05.func_name = psVar11;
          fun_05.rhs_data = &rhs_data;
          left_02.length = *local_168;
          left_02.offset = local_168[-1];
          fVar26 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                             (fun_05,left_02,*plVar6,pVVar21,iVar12);
          *(float *)(pdVar7 + iVar12 * 4) = fVar26;
          local_168 = local_168 + 2;
        }
      }
      else {
        uVar25 = 0;
        for (uVar19 = 0; uVar19 != count + 0x3f >> 6; uVar19 = uVar19 + 1) {
          puVar3 = (pVVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar17 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar17 = count;
            }
LAB_00cf1308:
            puVar18 = (uint64_t *)(pdVar5 + uVar25 * 0x10 + 8);
            for (; uVar20 = uVar25, uVar25 < uVar17; uVar25 = uVar25 + 1) {
              fun_00.lhs_data = &lhs_data;
              fun_00.func_name = psVar11;
              fun_00.rhs_data = &rhs_data;
              left.length = *puVar18;
              left.offset = puVar18[-1];
              fVar26 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                 (fun_00,left,*plVar6,pVVar21,uVar25);
              *(float *)(pdVar7 + uVar25 * 4) = fVar26;
              puVar18 = puVar18 + 2;
            }
          }
          else {
            uVar22 = puVar3[uVar19];
            uVar17 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar17 = count;
            }
            if (uVar22 == 0xffffffffffffffff) goto LAB_00cf1308;
            uVar20 = uVar17;
            if (uVar22 != 0) {
              puVar18 = (uint64_t *)(pdVar5 + uVar25 * 0x10 + 8);
              for (uVar16 = 0; uVar20 = uVar16 + uVar25, uVar20 < uVar17; uVar16 = uVar16 + 1) {
                if ((uVar22 >> (uVar16 & 0x3f) & 1) != 0) {
                  fun_01.lhs_data = &lhs_data;
                  fun_01.func_name = psVar11;
                  fun_01.rhs_data = &rhs_data;
                  left_00.length = *puVar18;
                  left_00.offset = puVar18[-1];
                  fVar26 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                     (fun_01,left_00,*plVar6,pVVar21,uVar20);
                  *(float *)(pdVar7 + uVar16 * 4 + uVar25 * 4) = fVar26;
                }
                puVar18 = puVar18 + 2;
              }
            }
          }
          uVar25 = uVar20;
        }
      }
      goto LAB_00cf11e4;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  else {
    if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
      if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
        pdVar5 = vec->data;
        pdVar7 = vec_00->data;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar8 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar21 = &result->validity;
        FlatVector::VerifyFlatVector(vec);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&pVVar21->super_TemplatedValidityMask<unsigned_long>,
                   &(vec->validity).super_TemplatedValidityMask<unsigned_long>,count);
        puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        FlatVector::VerifyFlatVector(vec_00);
        if (puVar3 == (unsigned_long *)0x0) {
          TemplatedValidityMask<unsigned_long>::Copy
                    (&pVVar21->super_TemplatedValidityMask<unsigned_long>,
                     &(vec_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
        }
        else {
          ValidityMask::Combine(pVVar21,&vec_00->validity,count);
        }
        if ((pVVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          lVar24 = 8;
          for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
            fun_10.lhs_data = &lhs_data;
            fun_10.func_name = psVar11;
            fun_10.rhs_data = &rhs_data;
            left_06.length = *(uint64_t *)(pdVar5 + lVar24);
            left_06.offset = *(uint64_t *)(pdVar5 + lVar24 + -8);
            right_06.length = *(uint64_t *)(pdVar7 + lVar24);
            right_06.offset = *(uint64_t *)(pdVar7 + lVar24 + -8);
            fVar26 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                               (fun_10,left_06,right_06,pVVar21,iVar12);
            *(float *)(pdVar8 + iVar12 * 4) = fVar26;
            lVar24 = lVar24 + 0x10;
          }
        }
        else {
          uVar25 = 0;
          for (uVar19 = 0; uVar19 != count + 0x3f >> 6; uVar19 = uVar19 + 1) {
            puVar3 = (pVVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar17 = uVar25 + 0x40;
              if (count <= uVar25 + 0x40) {
                uVar17 = count;
              }
LAB_00cf1917:
              uVar22 = uVar25 << 4 | 8;
              for (; uVar20 = uVar25, uVar25 < uVar17; uVar25 = uVar25 + 1) {
                fun_08.lhs_data = &lhs_data;
                fun_08.func_name = psVar11;
                fun_08.rhs_data = &rhs_data;
                left_04.length = *(uint64_t *)(pdVar5 + uVar22);
                left_04.offset = *(uint64_t *)(pdVar5 + (uVar22 - 8));
                right_04.length = *(uint64_t *)(pdVar7 + uVar22);
                right_04.offset = *(uint64_t *)(pdVar7 + (uVar22 - 8));
                fVar26 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                   (fun_08,left_04,right_04,pVVar21,uVar25);
                *(float *)(pdVar8 + uVar25 * 4) = fVar26;
                uVar22 = uVar22 + 0x10;
              }
            }
            else {
              uVar22 = puVar3[uVar19];
              uVar17 = uVar25 + 0x40;
              if (count <= uVar25 + 0x40) {
                uVar17 = count;
              }
              if (uVar22 == 0xffffffffffffffff) goto LAB_00cf1917;
              uVar20 = uVar17;
              if (uVar22 != 0) {
                uVar23 = uVar25 << 4 | 8;
                for (uVar16 = 0; uVar20 = uVar25 + uVar16, uVar20 < uVar17; uVar16 = uVar16 + 1) {
                  if ((uVar22 >> (uVar16 & 0x3f) & 1) != 0) {
                    fun_09.lhs_data = &lhs_data;
                    fun_09.func_name = psVar11;
                    fun_09.rhs_data = &rhs_data;
                    left_05.length = *(uint64_t *)(pdVar5 + uVar23);
                    left_05.offset = *(uint64_t *)(pdVar5 + (uVar23 - 8));
                    right_05.length = *(uint64_t *)(pdVar7 + uVar23);
                    right_05.offset = *(uint64_t *)(pdVar7 + (uVar23 - 8));
                    fVar26 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                       (fun_09,left_05,right_05,pVVar21,uVar20);
                    *(float *)(pdVar8 + uVar16 * 4 + uVar25 * 4) = fVar26;
                  }
                  uVar23 = uVar23 + 0x10;
                }
              }
            }
            uVar25 = uVar20;
          }
        }
      }
      else {
        UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
        Vector::ToUnifiedFormat(vec,count,&ldata);
        Vector::ToUnifiedFormat(vec_00,count,&local_c8);
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar5 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar21 = &result->validity;
        if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 &&
            ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
            iVar13 = iVar12;
            if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
              iVar13 = (idx_t)(ldata.sel)->sel_vector[iVar12];
            }
            iVar15 = iVar12;
            if ((local_c8.sel)->sel_vector != (sel_t *)0x0) {
              iVar15 = (idx_t)(local_c8.sel)->sel_vector[iVar12];
            }
            fun_02.lhs_data = &lhs_data;
            fun_02.func_name = psVar11;
            fun_02.rhs_data = &rhs_data;
            left_01.length = *(uint64_t *)(ldata.data + iVar13 * 0x10 + 8);
            left_01.offset = *(uint64_t *)(ldata.data + iVar13 * 0x10);
            right.length = *(uint64_t *)(local_c8.data + iVar15 * 0x10 + 8);
            right.offset = *(uint64_t *)(local_c8.data + iVar15 * 0x10);
            fVar26 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                               (fun_02,left_01,right,pVVar21,iVar12);
            *(float *)(pdVar5 + iVar12 * 4) = fVar26;
          }
        }
        else {
          for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
            iVar13 = iVar12;
            if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
              iVar13 = (idx_t)(ldata.sel)->sel_vector[iVar12];
            }
            iVar15 = iVar12;
            if ((local_c8.sel)->sel_vector != (sel_t *)0x0) {
              iVar15 = (idx_t)(local_c8.sel)->sel_vector[iVar12];
            }
            if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) ||
                ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar13 >> 6] >> (iVar13 & 0x3f) & 1) != 0)) &&
               ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0 ||
                ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar15 >> 6] >> (iVar15 & 0x3f) & 1) != 0)))) {
              fun_06.lhs_data = &lhs_data;
              fun_06.func_name = psVar11;
              fun_06.rhs_data = &rhs_data;
              left_03.length = *(uint64_t *)(ldata.data + iVar13 * 0x10 + 8);
              left_03.offset = *(uint64_t *)(ldata.data + iVar13 * 0x10);
              right_02.length = *(uint64_t *)(local_c8.data + iVar15 * 0x10 + 8);
              right_02.offset = *(uint64_t *)(local_c8.data + iVar15 * 0x10);
              fVar26 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                 (fun_06,left_03,right_02,pVVar21,iVar12);
              *(float *)(pdVar5 + iVar12 * 4) = fVar26;
            }
            else {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&pVVar21->super_TemplatedValidityMask<unsigned_long>,iVar12);
            }
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat(&local_c8);
        UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
      }
      goto LAB_00cf11e4;
    }
    plVar6 = (list_entry_t *)vec->data;
    puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar5 = vec_00->data;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar7 = result->data;
      FlatVector::VerifyFlatVector(result);
      pVVar21 = &result->validity;
      FlatVector::VerifyFlatVector(vec_00);
      TemplatedValidityMask<unsigned_long>::Copy
                (&pVVar21->super_TemplatedValidityMask<unsigned_long>,
                 &(vec_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        local_168 = (uint64_t *)(pdVar5 + 8);
        for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
          fun_07.lhs_data = &lhs_data;
          fun_07.func_name = psVar11;
          fun_07.rhs_data = &rhs_data;
          right_03.length = *local_168;
          right_03.offset = local_168[-1];
          fVar26 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                             (fun_07,*plVar6,right_03,pVVar21,iVar12);
          *(float *)(pdVar7 + iVar12 * 4) = fVar26;
          local_168 = local_168 + 2;
        }
      }
      else {
        uVar25 = 0;
        for (uVar19 = 0; uVar19 != count + 0x3f >> 6; uVar19 = uVar19 + 1) {
          puVar3 = (pVVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar17 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar17 = count;
            }
LAB_00cf15af:
            puVar18 = (uint64_t *)(pdVar5 + uVar25 * 0x10 + 8);
            for (; uVar20 = uVar25, uVar25 < uVar17; uVar25 = uVar25 + 1) {
              fun_03.lhs_data = &lhs_data;
              fun_03.func_name = psVar11;
              fun_03.rhs_data = &rhs_data;
              right_00.length = *puVar18;
              right_00.offset = puVar18[-1];
              fVar26 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                 (fun_03,*plVar6,right_00,pVVar21,uVar25);
              *(float *)(pdVar7 + uVar25 * 4) = fVar26;
              puVar18 = puVar18 + 2;
            }
          }
          else {
            uVar22 = puVar3[uVar19];
            uVar17 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar17 = count;
            }
            if (uVar22 == 0xffffffffffffffff) goto LAB_00cf15af;
            uVar20 = uVar17;
            if (uVar22 != 0) {
              puVar18 = (uint64_t *)(pdVar5 + uVar25 * 0x10 + 8);
              for (uVar16 = 0; uVar20 = uVar16 + uVar25, uVar20 < uVar17; uVar16 = uVar16 + 1) {
                if ((uVar22 >> (uVar16 & 0x3f) & 1) != 0) {
                  fun_04.lhs_data = &lhs_data;
                  fun_04.func_name = psVar11;
                  fun_04.rhs_data = &rhs_data;
                  right_01.length = *puVar18;
                  right_01.offset = puVar18[-1];
                  fVar26 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::ListGenericFold<float,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                     (fun_04,*plVar6,right_01,pVVar21,uVar20);
                  *(float *)(pdVar7 + uVar16 * 4 + uVar25 * 4) = fVar26;
                }
                puVar18 = puVar18 + 2;
              }
            }
          }
          uVar25 = uVar20;
        }
      }
      goto LAB_00cf11e4;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_00cf11e4:
  bVar9 = DataChunk::AllConstant(args);
  if (bVar9) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}